

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetRootDirection(void *arkode_mem,int *rootdir)

{
  ARKodeRootMem pAVar1;
  long in_RSI;
  ARKodeMem in_RDI;
  int i;
  ARKodeRootMem ark_root_mem;
  ARKodeMem ark_mem;
  int local_2c;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x511,"ARKodeSetRootDirection",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->root_mem == (ARKodeRootMem)0x0) {
    arkProcessError(in_RDI,-0x15,0x518,"ARKodeSetRootDirection",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    pAVar1 = in_RDI->root_mem;
    if (pAVar1->nrtfn == 0) {
      arkProcessError(in_RDI,-0x16,0x520,"ARKodeSetRootDirection",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"Rootfinding was not initialized.");
      local_4 = -0x16;
    }
    else {
      for (local_2c = 0; local_2c < pAVar1->nrtfn; local_2c = local_2c + 1) {
        pAVar1->rootdir[local_2c] = *(int *)(in_RSI + (long)local_2c * 4);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetRootDirection(void* arkode_mem, int* rootdir)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  int i;

  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;

  if (ark_root_mem->nrtfn == 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_ROOT);
    return (ARK_ILL_INPUT);
  }
  for (i = 0; i < ark_root_mem->nrtfn; i++)
  {
    ark_root_mem->rootdir[i] = rootdir[i];
  }
  return (ARK_SUCCESS);
}